

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O0

void __thiscall
OpenMD::AngleR::AngleR
          (AngleR *this,SimInfo *info,string *filename,string *sele1,int seleOffset,int seleOffset2,
          RealType len,int nrbins)

{
  undefined1 uVar1;
  ostream *this_00;
  StaticAnalyser *this_01;
  string *psVar2;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  undefined4 in_stack_00000008;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffcd8;
  StaticAnalyser *in_stack_fffffffffffffce0;
  SimInfo *in_stack_fffffffffffffce8;
  StaticAnalyser *in_stack_fffffffffffffcf0;
  undefined8 *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  allocator<char> *__a;
  SelectionEvaluator *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  SelectionEvaluator *this_04;
  string local_2a8 [32];
  stringstream local_288 [16];
  ostream local_278 [80];
  SimInfo *in_stack_fffffffffffffdd8;
  SelectionEvaluator *in_stack_fffffffffffffde0;
  string local_100 [32];
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [56];
  string local_80 [8];
  SimInfo *in_stack_ffffffffffffff88;
  SelectionManager *in_stack_ffffffffffffff90;
  string local_60 [48];
  undefined8 local_30;
  undefined4 local_28;
  undefined4 local_24;
  string *local_20;
  
  local_30 = in_XMM0_Qa;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,(string *)in_stack_fffffffffffffce0
             ,(uint)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  *in_RDI = &PTR__AngleR_0055e748;
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  *(undefined1 *)((long)in_RDI + 0xd1) = 1;
  *(undefined1 *)((long)in_RDI + 0xd2) = 1;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),local_20);
  std::__cxx11::string::string((string *)(in_RDI + 0x1f));
  SelectionManager::SelectionManager(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_04 = (SelectionEvaluator *)(in_RDI + 0x3c);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  psVar2 = (string *)(in_RDI + 0x55);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xff);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  *(undefined4 *)(in_RDI + 0x1a9) = local_24;
  *(undefined4 *)((long)in_RDI + 0xd4c) = local_28;
  in_RDI[0x1ab] = local_30;
  *(undefined4 *)(in_RDI + 0x1ac) = in_stack_00000008;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x131c43);
  __a = (allocator<char> *)(in_RDI + 0x1b1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x131c59);
  this_02 = (SelectionEvaluator *)(in_RDI + 0x1b4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x131c6f);
  getPrefix((string *)in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  SelectionEvaluator::loadScriptString(this_04,psVar2);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x55));
  if (!(bool)uVar1) {
    in_stack_fffffffffffffcf8 = in_RDI + 0x23;
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffcf0,
               (SelectionSet *)in_stack_fffffffffffffce8);
    SelectionSet::~SelectionSet((SelectionSet *)0x131d5c);
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffd00),
             (size_type)in_stack_fffffffffffffcf8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffd00),
             (size_type)in_stack_fffffffffffffcf8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffd00),
             (size_type)in_stack_fffffffffffffcf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)this_02,__a);
  StaticAnalyser::setAnalysisType(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  getPrefix((string *)in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::stringstream::stringstream(local_288);
  this_00 = std::operator<<(local_278," len = ");
  this_01 = (StaticAnalyser *)std::ostream::operator<<(this_00,(double)in_RDI[0x1ab]);
  psVar2 = (string *)std::operator<<((ostream *)this_01,", nrbins = ");
  std::ostream::operator<<(psVar2,*(int *)(in_RDI + 0x1ac));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_01,psVar2);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::stringstream::~stringstream(local_288);
  return;
}

Assistant:

AngleR::AngleR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, int seleOffset, int seleOffset2,
                 RealType len, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      doVect_(false), doOffset_(true), doOffset2_(true),
      selectionScript1_(sele1), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), seleOffset_(seleOffset),
      seleOffset2_(seleOffset2), len_(len), nRBins_(nrbins) {
    setOutputName(getPrefix(filename) + ".AngleR");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    histogram_.resize(nRBins_);
    count_.resize(nRBins_);
    avgAngleR_.resize(nRBins_);

    setAnalysisType("radial density function Angle(r)");
    setOutputName(getPrefix(filename) + ".AngleR");
    std::stringstream params;
    params << " len = " << len_ << ", nrbins = " << nRBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }